

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O0

int __thiscall CTcSymObjBase::has_superclass(CTcSymObjBase *this,CTcSymObj *sc_sym)

{
  tc_symtype_t tVar1;
  int iVar2;
  CTcPrsSymtab *sym;
  CTcPrsSymtab *this_00;
  CTcSymObjBase *this_01;
  CTcSymObjBase *in_RSI;
  long in_RDI;
  CTcSymObj *entry_sym;
  CTPNSuperclass *entry;
  CTPNSuperclass *this_02;
  
  this_02 = *(CTPNSuperclass **)(in_RDI + 0x78);
  do {
    if (this_02 == (CTPNSuperclass *)0x0) {
      return 0;
    }
    sym = CTcParser::get_global_symtab(G_prs);
    this_00 = (CTcPrsSymtab *)CTPNSuperclass::get_sym_txt(this_02);
    CTPNSuperclass::get_sym_len(this_02);
    this_01 = (CTcSymObjBase *)CTcPrsSymtab::find(this_00,(textchar_t *)sym,0x25cb85);
    if ((this_01 != (CTcSymObjBase *)0x0) &&
       (tVar1 = CTcSymbolBase::get_type((CTcSymbolBase *)this_01), tVar1 == TC_SYM_OBJ)) {
      if (this_01 == in_RSI) {
        return 1;
      }
      iVar2 = has_superclass(in_RSI,(CTcSymObj *)this_02);
      if (iVar2 != 0) {
        return 1;
      }
    }
    this_02 = this_02->nxt_;
  } while( true );
}

Assistant:

int CTcSymObjBase::has_superclass(class CTcSymObj *sc_sym) const
{
    /* 
     *   Scan my direct superclasses.  For each one, check to see if my
     *   superclass matches the given superclass, or if my superclass
     *   inherits from the given superclass.  
     */
    for (CTPNSuperclass *entry = sc_name_head_ ; entry != 0 ;
         entry = entry->nxt_)
    {
        /* look up this symbol */
        CTcSymObj *entry_sym = (CTcSymObj *)G_prs->get_global_symtab()->find(
            entry->get_sym_txt(), entry->get_sym_len());

        /* 
         *   if the entry's symbol doesn't exist or isn't an object symbol,
         *   skip it 
         */
        if (entry_sym == 0 || entry_sym->get_type() != TC_SYM_OBJ)
            continue;

        /* 
         *   if it matches the given superclass, we've found the given
         *   superclass among our direct superclasses, so we definitely have
         *   the given superclass 
         */
        if (entry_sym == sc_sym)
            return TRUE;

        /* 
         *   ask the symbol if the given class is among its direct or
         *   indirect superclasses - if it's a superclass of my superclass,
         *   it's also my superclass 
         */
        if (entry_sym->has_superclass(sc_sym))
            return TRUE;
    }

    /* 
     *   we didn't find the given class anywhere among our superclasses or
     *   their superclasses, so it must not be a superclass of ours 
     */
    return FALSE;
}